

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio_sock2.c
# Opt level: O0

int BIO_accept_ex(int accept_sock,BIO_ADDR *addr_,int options)

{
  int iVar1;
  int iVar2;
  sockaddr *__addr;
  uint *puVar3;
  uint in_EDX;
  BIO_ADDR *in_RSI;
  int in_EDI;
  BIO_ADDR *addr;
  BIO_ADDR locaddr;
  int accepted_sock;
  socklen_t len;
  BIO_ADDR *pBVar4;
  char *in_stack_ffffffffffffff70;
  socklen_t local_18;
  uint local_14;
  int local_4;
  
  if (in_RSI == (BIO_ADDR *)0x0) {
    in_RSI = (BIO_ADDR *)&stack0xffffffffffffff74;
  }
  local_18 = 0x70;
  pBVar4 = in_RSI;
  local_14 = in_EDX;
  __addr = BIO_ADDR_sockaddr_noconst(in_RSI);
  iVar2 = (int)((ulong)pBVar4 >> 0x20);
  local_4 = accept(in_EDI,(sockaddr *)__addr,&local_18);
  if (local_4 == -1) {
    iVar1 = BIO_sock_should_retry(-1);
    if (iVar1 == 0) {
      ERR_new();
      ERR_set_debug(in_stack_ffffffffffffff70,iVar2,in_RSI->field4);
      puVar3 = (uint *)__errno_location();
      ERR_set_error(2,(int)(ulong)*puVar3,"calling accept()");
      ERR_new();
      ERR_set_debug(in_stack_ffffffffffffff70,iVar2,in_RSI->field4);
      ERR_set_error(0x20,100,(char *)0x0);
    }
    local_4 = -1;
  }
  else {
    iVar2 = BIO_socket_nbio(local_4,(uint)((local_14 & 8) != 0));
    if (iVar2 == 0) {
      close(local_4);
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

int BIO_accept_ex(int accept_sock, BIO_ADDR *addr_, int options)
{
    socklen_t len;
    int accepted_sock;
    BIO_ADDR locaddr;
    BIO_ADDR *addr = addr_ == NULL ? &locaddr : addr_;

    len = sizeof(*addr);
    accepted_sock = accept(accept_sock,
                           BIO_ADDR_sockaddr_noconst(addr), &len);
    if (accepted_sock == -1) {
        if (!BIO_sock_should_retry(accepted_sock)) {
            ERR_raise_data(ERR_LIB_SYS, get_last_socket_error(),
                           "calling accept()");
            ERR_raise(ERR_LIB_BIO, BIO_R_ACCEPT_ERROR);
        }
        return INVALID_SOCKET;
    }

    if (!BIO_socket_nbio(accepted_sock, (options & BIO_SOCK_NONBLOCK) != 0)) {
        closesocket(accepted_sock);
        return INVALID_SOCKET;
    }

    return accepted_sock;
}